

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O1

void Pm_GetHostErrorText(char *msg,uint len)

{
  if (msg == (char *)0x0) {
    __assert_fail("msg",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_common/portmidi.c"
                  ,0x128,"void Pm_GetHostErrorText(char *, unsigned int)");
  }
  if (len != 0) {
    if (pm_hosterror != 0) {
      strncpy(msg,pm_hosterror_text,(ulong)len);
      pm_hosterror = 0;
      pm_hosterror_text[0] = '\0';
      msg = msg + (len - 1);
    }
    *msg = '\0';
    return;
  }
  __assert_fail("len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_common/portmidi.c"
                ,0x129,"void Pm_GetHostErrorText(char *, unsigned int)");
}

Assistant:

PMEXPORT void Pm_GetHostErrorText(char * msg, unsigned int len) {
    assert(msg);
    assert(len > 0);
    if (pm_hosterror) {
        strncpy(msg, (char *) pm_hosterror_text, len);
        pm_hosterror = FALSE;
        pm_hosterror_text[0] = 0; /* clear the message; not necessary, but it
                                     might help with debugging */
        msg[len - 1] = 0; /* make sure string is terminated */
    } else {
        msg[0] = 0; /* no string to return */
    }
}